

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineComputer::ComputeLinkLibs_abi_cxx11_
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli)

{
  bool bVar1;
  TargetType TVar2;
  ItemVector *this_00;
  pointer pIVar3;
  string local_90;
  string local_70;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_50;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_48;
  const_iterator li;
  ItemVector *items;
  cmComputeLinkInformation *cli_local;
  cmLinkLineComputer *this_local;
  string *linkLibs;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this_00 = cmComputeLinkInformation::GetItems(cli);
  local_48._M_current =
       (Item *)std::
               vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               ::begin(this_00);
  do {
    local_50._M_current =
         (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::end(this_00);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
             ::operator->(&local_48);
    if (pIVar3->Target == (cmGeneratorTarget *)0x0) {
LAB_00727124:
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_48);
      if ((pIVar3->IsPath & 1U) == 0) {
        pIVar3 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_48);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pIVar3);
      }
      else {
        pIVar3 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_48);
        (*this->_vptr_cmLinkLineComputer[2])(&local_90,this,pIVar3);
        ConvertToOutputFormat(&local_70,this,&local_90);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    else {
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_48);
      TVar2 = cmGeneratorTarget::GetType(pIVar3->Target);
      if (TVar2 != INTERFACE_LIBRARY) goto LAB_00727124;
    }
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkLibs(cmComputeLinkInformation& cli)
{
  std::string linkLibs;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for (ItemVector::const_iterator li = items.begin(); li != items.end();
       ++li) {
    if (li->Target &&
        li->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (li->IsPath) {
      linkLibs +=
        this->ConvertToOutputFormat(this->ConvertToLinkReference(li->Value));
    } else {
      linkLibs += li->Value;
    }
    linkLibs += " ";
  }
  return linkLibs;
}